

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O1

void duckdb::TemplatedFetchCommittedRange<duckdb::uhugeint_t>
               (UpdateInfo *info,idx_t start,idx_t end,idx_t result_offset,Vector *result)

{
  data_ptr_t pdVar1;
  undefined8 uVar2;
  bool bVar3;
  ulong uVar4;
  undefined8 *puVar5;
  ulong uVar6;
  
  if (info->N != 0) {
    puVar5 = (undefined8 *)((long)&info[1].segment + (ulong)info->max * 4);
    pdVar1 = result->data;
    uVar4 = 0;
    do {
      uVar6 = (ulong)*(uint *)((long)&info[1].segment + uVar4 * 4);
      bVar3 = false;
      if ((start <= uVar6) && (bVar3 = true, uVar6 < end)) {
        uVar2 = puVar5[1];
        *(undefined8 *)(pdVar1 + uVar6 * 0x10 + (result_offset - start) * 0x10) = *puVar5;
        *(undefined8 *)(pdVar1 + uVar6 * 0x10 + (result_offset - start) * 0x10 + 8) = uVar2;
        bVar3 = false;
      }
      if (bVar3) {
        return;
      }
      uVar4 = uVar4 + 1;
      puVar5 = puVar5 + 2;
    } while (uVar4 < info->N);
  }
  return;
}

Assistant:

static void MergeUpdateInfoRange(UpdateInfo &current, idx_t start, idx_t end, idx_t result_offset, T *result_data) {
	auto tuples = current.GetTuples();
	auto info_data = current.GetData<T>();
	for (idx_t i = 0; i < current.N; i++) {
		auto tuple_idx = tuples[i];
		if (tuple_idx < start) {
			continue;
		} else if (tuple_idx >= end) {
			break;
		}
		auto result_idx = result_offset + tuple_idx - start;
		result_data[result_idx] = info_data[i];
	}
}